

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_iterator.h
# Opt level: O0

void __thiscall
cfd::core::IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper
          (IteratorWrapper<cfd::core::ScriptElement> *this,
          vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *vector,
          string *error_message,bool is_reverse)

{
  const_iterator cVar1;
  bool is_reverse_local;
  string *error_message_local;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *vector_local;
  IteratorWrapper<cfd::core::ScriptElement> *this_local;
  
  this->_vptr_IteratorWrapper = (_func_int **)&PTR__IteratorWrapper_00896208;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&this->vector_,vector);
  cVar1 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::cbegin
                    (&this->vector_);
  (this->iterator_)._M_current = cVar1._M_current;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::crbegin
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &this->reverse_iterator_);
  ::std::__cxx11::string::string((string *)&this->error_message_,(string *)error_message);
  this->reverse_ = is_reverse;
  return;
}

Assistant:

IteratorWrapper(
      std::vector<T> vector, std::string error_message,
      bool is_reverse = false)
      : vector_(vector),
        iterator_(vector_.cbegin()),
        reverse_iterator_(vector_.crbegin()),
        error_message_(error_message),
        reverse_(is_reverse) {
    // do nothing
  }